

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O3

bool __thiscall cppcms::widgets::file::validate(file *this)

{
  uint *puVar1;
  _func_int *p_Var2;
  long lVar3;
  _Alloc_hider _Var4;
  pointer pcVar5;
  char cVar6;
  int iVar7;
  ulong uVar8;
  ulong *puVar9;
  istream *piVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  bool bVar14;
  string magic;
  vector<char,_std::allocator<char>_> buf;
  allocator_type local_59;
  string local_58;
  vector<char,_std::allocator<char>_> local_38;
  
  p_Var2 = (this->super_base_html_input)._vptr_base_html_input[-3];
  uVar13 = *(uint *)(&(this->super_base_html_input).field_0x1f0 + (long)p_Var2);
  if ((uVar13 & 2) == 0) {
    if (((this->super_base_html_input).field_0x80 & 2) != 0) {
      *(uint *)(&(this->super_base_html_input).field_0x1f0 + (long)p_Var2) = uVar13 & 0xfffffffc;
      return false;
    }
    *(uint *)(&(this->super_base_html_input).field_0x1f0 + (long)p_Var2) = uVar13 | 1;
    return true;
  }
  if ((uVar13 & 1) == 0) {
    return false;
  }
  if (((*(int *)&(this->super_base_html_input).field_0x34 == -1) &&
      (*(int *)&(this->super_base_html_input).field_0x30 == -1)) ||
     ((uVar8 = http::file::size(*(file **)&(this->super_base_html_input).field_0x88),
      uVar8 <= (ulong)(long)*(int *)&(this->super_base_html_input).field_0x34 &&
      (uVar12 = (ulong)*(int *)&(this->super_base_html_input).field_0x30,
      uVar12 <= uVar8 || uVar12 == 0xffffffffffffffff)))) {
    if (*(long *)&(this->super_base_html_input).field_0x58 != 0) {
      http::file::mime_abi_cxx11_(&local_58,*(file **)&(this->super_base_html_input).field_0x88);
      _Var4._M_p = local_58._M_dataplus._M_p;
      if (local_58._M_string_length == *(size_t *)&(this->super_base_html_input).field_0x58) {
        if (local_58._M_string_length == 0) {
          bVar14 = false;
        }
        else {
          iVar7 = bcmp(local_58._M_dataplus._M_p,*(void **)&(this->super_base_html_input).field_0x50
                       ,local_58._M_string_length);
          bVar14 = iVar7 != 0;
        }
      }
      else {
        bVar14 = true;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var4._M_p != &local_58.field_2) {
        operator_delete(_Var4._M_p);
      }
      if (bVar14) goto LAB_001fa12a;
    }
    cVar6 = booster::regex::empty();
    if (cVar6 == '\0') {
      http::file::mime_abi_cxx11_(&local_58,*(file **)&(this->super_base_html_input).field_0x88);
      cVar6 = booster::regex::match
                        (&(this->super_base_html_input).field_0x70,local_58._M_dataplus._M_p,
                         (int)local_58._M_string_length + (int)local_58._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p);
      }
      if (cVar6 == '\0') goto LAB_001fa12a;
    }
    cVar6 = booster::regex::empty();
    if (cVar6 == '\0') {
      http::file::filename_abi_cxx11_(&local_58,*(file **)&(this->super_base_html_input).field_0x88)
      ;
      cVar6 = booster::regex::match
                        (&(this->super_base_html_input).field_0x78,local_58._M_dataplus._M_p,
                         (int)local_58._M_string_length + (int)local_58._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p);
      }
      if (cVar6 == '\0') goto LAB_001fa12a;
    }
    if (((&(this->super_base_html_input).field_0x1f0)
         [(long)(this->super_base_html_input)._vptr_base_html_input[-3]] & 1) != 0) {
      lVar11 = *(long *)&(this->super_base_html_input).field_0x38;
      lVar3 = *(long *)&(this->super_base_html_input).field_0x40;
      if (lVar11 == lVar3) {
        return true;
      }
      puVar9 = (ulong *)(lVar11 + 8);
      uVar13 = 1;
      uVar8 = 0;
      do {
        if (uVar8 < *puVar9) {
          uVar8 = *puVar9;
        }
        uVar12 = (ulong)uVar13;
        puVar9 = puVar9 + 4;
        uVar13 = uVar13 + 1;
      } while (uVar12 < (ulong)(lVar3 - lVar11 >> 5));
      local_58._M_dataplus._M_p = local_58._M_dataplus._M_p & 0xffffffffffffff00;
      std::vector<char,_std::allocator<char>_>::vector
                (&local_38,uVar8 + 1,(value_type_conflict *)&local_58,&local_59);
      piVar10 = http::file::data(*(file **)&(this->super_base_html_input).field_0x88);
      std::istream::seekg(piVar10,0,0);
      piVar10 = http::file::data(*(file **)&(this->super_base_html_input).field_0x88);
      std::istream::read((char *)piVar10,
                         (long)local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_start);
      pcVar5 = local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar10 = http::file::data(*(file **)&(this->super_base_html_input).field_0x88);
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,pcVar5,pcVar5 + *(long *)(piVar10 + 8));
      piVar10 = http::file::data(*(file **)&(this->super_base_html_input).field_0x88);
      std::istream::seekg(piVar10,0,0);
      puVar1 = (uint *)(&(this->super_base_html_input).field_0x1f0 +
                       (long)(this->super_base_html_input)._vptr_base_html_input[-3]);
      *puVar1 = *puVar1 & 0xfffffffe;
      lVar11 = *(long *)&(this->super_base_html_input).field_0x38;
      if (*(long *)&(this->super_base_html_input).field_0x40 != lVar11) {
        uVar8 = 0;
        uVar12 = 1;
        do {
          iVar7 = std::__cxx11::string::compare
                            ((ulong)&local_58,0,*(string **)(lVar11 + 8 + uVar8 * 0x20));
          if (iVar7 == 0) {
            puVar1 = (uint *)(&(this->super_base_html_input).field_0x1f0 +
                             (long)(this->super_base_html_input)._vptr_base_html_input[-3]);
            *puVar1 = *puVar1 | 1;
            break;
          }
          lVar11 = *(long *)&(this->super_base_html_input).field_0x38;
          bVar14 = uVar12 < (ulong)(*(long *)&(this->super_base_html_input).field_0x40 - lVar11 >> 5
                                   );
          uVar8 = uVar12;
          uVar12 = (ulong)((int)uVar12 + 1);
        } while (bVar14);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p);
      }
      if (local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      return (bool)((&(this->super_base_html_input).field_0x1f0)
                    [(long)(this->super_base_html_input)._vptr_base_html_input[-3]] & 1);
    }
  }
  else {
LAB_001fa12a:
    puVar1 = (uint *)(&(this->super_base_html_input).field_0x1f0 +
                     (long)(this->super_base_html_input)._vptr_base_html_input[-3]);
    *puVar1 = *puVar1 & 0xfffffffe;
  }
  return false;
}

Assistant:

bool file::validate()
{
	if(!set()) {
		if(check_non_empty_) {
			valid(false);
			return false;
		}
		else {
			valid(true);
			return true;
		}
	}
	if(!valid())
		return false;
	if(size_max_ != -1 || size_min_!= -1) {
		size_t file_size = file_->size();
		if(size_max_ != -1 && file_size > size_t(size_max_)) {
			valid(false);
			return false;
		}
		if(size_min_ != -1 && file_size < size_t(size_min_)) {
			valid(false);
			return false;
		}
	}
	if(!mime_string_.empty() && file_->mime()!=mime_string_) {
		valid(false);
		return false;
	}
	if(!mime_regex_.empty() && !booster::regex_match(file_->mime(),mime_regex_)){
		valid(false);
		return false;
	}
	if(!filename_regex_.empty() && !booster::regex_match(file_->filename(),filename_regex_)){
		valid(false);
		return false;
	}
	if(valid() && !magics_.empty()) {
		size_t size_max = 0;
		for(unsigned i=0;i<magics_.size();i++)
			size_max=std::max(magics_[i].size(),size_max);
		std::vector<char> buf(size_max+1,0);
		file_->data().seekg(0);
		file_->data().read(&buf.front(),size_max);
		std::string magic(&buf.front(),file_->data().gcount());
		file_->data().seekg(0);
		valid(false);
		for(unsigned i=0;i<magics_.size();i++) {
			if(magic.compare(0,magics_[i].size(),magics_[i])==0) {
				valid(true);
				break;
			}
		}
	}
	return valid();

}